

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

Box * __thiscall amrex::BATransformer::operator()(BATransformer *this,Box *ab)

{
  Box *in_RDX;
  undefined4 *in_RSI;
  Box *in_RDI;
  Box *in_stack_00000090;
  Box *in_stack_00000098;
  BATbndryReg *in_stack_000000a0;
  Box *in_stack_000000d0;
  BATindexType_coarsenRatio *in_stack_000000d8;
  
  switch(*in_RSI) {
  case 0:
    BATnull::operator()(in_RDI,(BATnull *)(in_RSI + 1),in_RDX);
    break;
  case 1:
    BATindexType::operator()(in_RDI,(BATindexType *)(in_RSI + 1),in_RDX);
    break;
  case 2:
    BATcoarsenRatio::operator()((BATcoarsenRatio *)in_stack_00000098,in_stack_00000090);
    break;
  case 3:
    BATindexType_coarsenRatio::operator()(in_stack_000000d8,in_stack_000000d0);
    break;
  default:
    BATbndryReg::operator()(in_stack_000000a0,in_stack_00000098);
  }
  return in_RDI;
}

Assistant:

Box operator() (Box const& ab) const noexcept {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null(ab);
        case     BATType::indexType:
            return m_op.m_indexType(ab);
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio(ab);
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio(ab);
        default:
            return m_op.m_bndryReg(ab);
        }
    }